

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_rtree.cpp
# Opt level: O0

bool __thiscall ON_RTreeIterator::Prev(ON_RTreeIterator *this)

{
  ON_RTreeIterator *pOVar1;
  int iVar2;
  ON_RTreeIterator *local_28;
  StackElement *sp;
  StackElement *sp0;
  ON_RTreeIterator *this_local;
  
  if (this->m_sp == (StackElement *)0x0) {
    this_local._7_1_ = false;
  }
  else {
    iVar2 = this->m_sp->m_branchIndex + -1;
    this->m_sp->m_branchIndex = iVar2;
    if (iVar2 < 0) {
      local_28 = (ON_RTreeIterator *)this->m_sp;
      this->m_sp = (StackElement *)0x0;
      do {
        if (local_28 <= this) {
          return false;
        }
        pOVar1 = local_28 + -1;
        iVar2 = *(int *)&local_28[-1].m_root + -1;
        *(int *)&local_28[-1].m_root = iVar2;
        local_28 = (ON_RTreeIterator *)&pOVar1->m_sp;
      } while (iVar2 < 0);
      this_local._7_1_ = PushChildren(this,(StackElement *)&pOVar1->m_sp,false);
    }
    else {
      this_local._7_1_ = true;
    }
  }
  return this_local._7_1_;
}

Assistant:

bool ON_RTreeIterator::Prev()
{ 
  if ( 0 == m_sp )
    return false; // invalid iterator

  if ( --(m_sp->m_branchIndex) >= 0 )
    return true; // m_sp->m_node is always at leaf level

  // pop the stack until we find an element with room to move over.
  StackElement* sp0 = &m_stack[0];
  StackElement* sp = m_sp;
  m_sp = 0;
  while ( sp > sp0 )
  {        
    sp--; // pop the stack

    // --(sp->m_branchIndex) moves to the previous element in sp->m_node.
    if ( --(sp->m_branchIndex) < 0 )
      continue; // this element is used up

    // Since we've popped the stack, we cannot be at the leaf level.
    // PushFirst() pushes the first child onto the stack until 
    // it reaches the leaf level.
    return PushChildren(sp,false);
  }
  return false; // we were at the last element and now there are no more.
}